

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

ptls_iovec_t x9_62_encode_point(EC_GROUP *group,EC_POINT *point,BN_CTX *bn_ctx)

{
  ptls_iovec_t pVar1;
  size_t sVar2;
  ptls_iovec_t vec;
  BN_CTX *bn_ctx_local;
  EC_POINT *point_local;
  EC_GROUP *group_local;
  size_t local_10;
  
  local_10 = EC_POINT_point2oct((EC_GROUP *)group,(EC_POINT *)point,POINT_CONVERSION_UNCOMPRESSED,
                                (uchar *)0x0,0,(BN_CTX *)bn_ctx);
  if (local_10 == 0) {
    group_local = (EC_GROUP *)0x0;
    local_10 = 0;
  }
  else {
    group_local = (EC_GROUP *)malloc(local_10);
    if (group_local == (EC_GROUP *)0x0) {
      group_local = (EC_GROUP *)0x0;
      local_10 = 0;
    }
    else {
      sVar2 = EC_POINT_point2oct((EC_GROUP *)group,(EC_POINT *)point,POINT_CONVERSION_UNCOMPRESSED,
                                 (uchar *)group_local,local_10,(BN_CTX *)bn_ctx);
      if (sVar2 != local_10) {
        free(group_local);
        group_local = (EC_GROUP *)0x0;
        local_10 = 0;
      }
    }
  }
  pVar1.len = local_10;
  pVar1.base = (uint8_t *)group_local;
  return pVar1;
}

Assistant:

static ptls_iovec_t x9_62_encode_point(const EC_GROUP *group, const EC_POINT *point, BN_CTX *bn_ctx)
{
    ptls_iovec_t vec;

    if ((vec.len = EC_POINT_point2oct(group, point, POINT_CONVERSION_UNCOMPRESSED, NULL, 0, bn_ctx)) == 0)
        return (ptls_iovec_t){NULL};
    if ((vec.base = malloc(vec.len)) == NULL)
        return (ptls_iovec_t){NULL};
    if (EC_POINT_point2oct(group, point, POINT_CONVERSION_UNCOMPRESSED, vec.base, vec.len, bn_ctx) != vec.len) {
        free(vec.base);
        return (ptls_iovec_t){NULL};
    }

    return vec;
}